

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
GrowAndEmplaceBack<s2shapeutil::ShapeEdge>
          (InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
           *this,ShapeEdge *args)

{
  VType *pVVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ShapeEdgeId SVar5;
  VType VVar6;
  VType VVar7;
  VType VVar8;
  VType VVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ShapeEdge *pSVar16;
  Rep *pRVar17;
  ulong uVar18;
  long lVar19;
  Allocation new_allocation;
  
  uVar4 = (this->allocator_and_tag_).tag_.size_;
  uVar18 = uVar4 >> 1;
  uVar15 = 0x10;
  if ((uVar4 & 1) != 0) {
    uVar15 = *(ulong *)&this->rep_;
  }
  if (uVar18 == uVar15) {
    pSVar16 = __gnu_cxx::new_allocator<s2shapeutil::ShapeEdge>::allocate
                        ((new_allocator<s2shapeutil::ShapeEdge> *)this,uVar4 & 0xfffffffffffffffe,
                         (void *)0x0);
    pSVar16[uVar18].edge_.v1.c_[2] = (args->edge_).v1.c_[2];
    SVar5 = args->id_;
    VVar6 = (args->edge_).v0.c_[0];
    VVar7 = (args->edge_).v0.c_[1];
    VVar8 = (args->edge_).v0.c_[2];
    VVar9 = (args->edge_).v1.c_[1];
    pSVar16[uVar18].edge_.v1.c_[0] = (args->edge_).v1.c_[0];
    pSVar16[uVar18].edge_.v1.c_[1] = VVar9;
    pVVar1 = pSVar16[uVar18].edge_.v0.c_ + 1;
    *pVVar1 = VVar7;
    pVVar1[1] = VVar8;
    pSVar16[uVar18].id_ = SVar5;
    pSVar16[uVar18].edge_.v0.c_[0] = VVar6;
    if (((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
      pRVar17 = &this->rep_;
    }
    else {
      pRVar17 = *(Rep **)((long)&this->rep_ + 8);
    }
    if (1 < uVar4) {
      lVar19 = 0;
      do {
        *(undefined8 *)((long)(pSVar16->edge_).v1.c_ + lVar19 + 0x10) =
             *(undefined8 *)((long)pRVar17 + lVar19 + 0x30);
        uVar10 = *(undefined8 *)((long)pRVar17 + lVar19);
        uVar11 = ((undefined8 *)((long)pRVar17 + lVar19))[1];
        puVar2 = (undefined8 *)((long)pRVar17 + lVar19 + 0x10);
        uVar12 = *puVar2;
        uVar13 = puVar2[1];
        puVar2 = (undefined8 *)((long)pRVar17 + lVar19 + 0x20);
        uVar14 = puVar2[1];
        puVar3 = (undefined8 *)((long)(pSVar16->edge_).v1.c_ + lVar19);
        *puVar3 = *puVar2;
        puVar3[1] = uVar14;
        puVar2 = (undefined8 *)((long)(pSVar16->edge_).v0.c_ + lVar19 + 8);
        *puVar2 = uVar12;
        puVar2[1] = uVar13;
        puVar2 = (undefined8 *)((long)(pSVar16->edge_).v0.c_ + lVar19 + -8);
        *puVar2 = uVar10;
        puVar2[1] = uVar11;
        lVar19 = lVar19 + 0x38;
      } while (uVar18 * 0x38 - lVar19 != 0);
    }
    new_allocation.buffer_ = pSVar16;
    new_allocation.capacity_ = uVar4 & 0xfffffffffffffffe;
    ResetAllocation(this,new_allocation,uVar18 + 1);
    return pSVar16 + uVar18;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<s2shapeutil::ShapeEdge, 16>::GrowAndEmplaceBack(Args &&...) [T = s2shapeutil::ShapeEdge, N = 16, A = std::allocator<s2shapeutil::ShapeEdge>, Args = <s2shapeutil::ShapeEdge>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }